

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

Token __thiscall flow::lang::Lexer::parseNumber(Lexer *this,int base)

{
  ulong uVar1;
  bool bVar2;
  Token TVar3;
  int iVar4;
  char cVar5;
  allocator<char> local_49;
  string local_48;
  
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  this->numberValue_ = 0;
  cVar5 = (char)this + -0x58;
  while ((iVar4 = this->currentChar_, 0x2f < iVar4 && ((int)(iVar4 - 0x30U) < base))) {
    this->numberValue_ = (ulong)(iVar4 - 0x30U) + this->numberValue_ * (ulong)(uint)base;
    std::__cxx11::string::push_back(cVar5);
    nextChar(this,true);
  }
  uVar1 = (this->stringValue_)._M_string_length;
  if (uVar1 < 5) {
    if (iVar4 == 0x3a) {
      bVar2 = true;
LAB_0012c3a5:
      TVar3 = continueParseIPv6(this,bVar2);
      return TVar3;
    }
    if (uVar1 != 4) {
      bVar2 = isHexChar(this);
      if (bVar2) {
        bVar2 = false;
        goto LAB_0012c3a5;
      }
      iVar4 = this->currentChar_;
    }
  }
  if (iVar4 == 0x2e) {
    do {
      std::__cxx11::string::push_back(cVar5);
      nextChar(this,true);
    } while (this->currentChar_ - 0x30U < 10);
    bVar2 = consume(this,'.');
    if (bVar2) {
      std::__cxx11::string::push_back(cVar5);
      while (this->currentChar_ - 0x30U < 10) {
        std::__cxx11::string::push_back(cVar5);
        nextChar(this,true);
      }
      bVar2 = consume(this,'.');
      if (bVar2) {
        std::__cxx11::string::push_back(cVar5);
        while (this->currentChar_ - 0x30U < 10) {
          std::__cxx11::string::push_back(cVar5);
          nextChar(this,true);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,(this->stringValue_)._M_dataplus._M_p,&local_49);
        util::IPAddress::set(&this->ipValue_,&local_48,V4);
        std::__cxx11::string::~string((string *)&local_48);
        if (this->currentChar_ != 0x2f) {
          this->token_ = IP;
          return IP;
        }
        TVar3 = continueCidr(this,0x20);
        return TVar3;
      }
    }
    this->token_ = Unknown;
    TVar3 = Unknown;
  }
  else {
    this->token_ = Number;
    TVar3 = Number;
  }
  return TVar3;
}

Assistant:

Token Lexer::parseNumber(int base) {
  stringValue_.clear();
  numberValue_ = 0;

  while (currentChar() >= '0' && (currentChar() - '0') < base) {
    numberValue_ *= base;
    numberValue_ += currentChar() - '0';
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  // ipv6HexDigit4 *(':' ipv6HexDigit4) ['::' [ipv6HexSeq]]
  if (stringValue_.size() <= 4 && currentChar() == ':')
    return continueParseIPv6(true);

  if (stringValue_.size() < 4 && isHexChar())
    return continueParseIPv6(false);

  if (currentChar() != '.')
    return token_ = Token::Number;

  // 2nd IP component
  stringValue_ += '.';
  nextChar();
  while (std::isdigit(currentChar())) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  // 3rd IP component
  if (!consume('.')) return token_ = Token::Unknown;

  stringValue_ += '.';
  while (std::isdigit(currentChar())) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  // 4th IP component
  if (!consume('.')) return token_ = Token::Unknown;

  stringValue_ += '.';
  while (std::isdigit(currentChar())) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  ipValue_.set(stringValue_.c_str(), util::IPAddress::Family::V4);

  if (currentChar() != '/') return token_ = Token::IP;

  // IPv4 CIDR
  return continueCidr(32);
}